

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int duckdb_fmt::v6::internal::
    parse_nonnegative_int<wchar_t,duckdb_fmt::v6::internal::id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>>,wchar_t,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
              (wchar_t **begin,wchar_t *end,
              id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
              *eh)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  uint uVar4;
  allocator local_39;
  string local_38;
  
  wVar1 = **begin;
  pwVar2 = *begin + 1;
  if (wVar1 == L'0') {
    *begin = pwVar2;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pwVar3 = pwVar2;
      if (0xccccccc < uVar4) {
        *begin = pwVar3 + -1;
        uVar4 = 0x80000000;
        goto LAB_01b03d4b;
      }
      uVar4 = (uVar4 * 10 + wVar1) - 0x30;
      if (pwVar3 == end) break;
      wVar1 = *pwVar3;
      pwVar2 = pwVar3 + 1;
    } while ((uint)(wVar1 + L'\xffffffd0') < 10);
    *begin = pwVar3;
    if ((int)uVar4 < 0) {
LAB_01b03d4b:
      std::__cxx11::string::string((string *)&local_38,"number is too big",&local_39);
      id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::on_error(eh,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return uVar4;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}